

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O2

void __thiscall QtMWidgets::RowsSeparator::paintEvent(RowsSeparator *this,QPaintEvent *param_1)

{
  QPalette *this_00;
  QPainter p;
  
  QPainter::QPainter(&p,(QPaintDevice *)&this->field_0x10);
  this_00 = (QPalette *)QWidget::palette();
  QPalette::color(this_00,Midlight);
  QPainter::setPen((QColor *)&p);
  QPainter::drawLine(&p,0xb,0,(*(int *)(*(long *)&this->field_0x20 + 0x1c) -
                              *(int *)(*(long *)&this->field_0x20 + 0x14)) + 1,0);
  QPainter::~QPainter(&p);
  return;
}

Assistant:

void paintEvent( QPaintEvent * ) override
	{
		QPainter p( this );

		p.setPen( palette().color( QPalette::Midlight ) );
		p.drawLine( 11, 0, width(), 0 );
	}